

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

void ReconstructRow(VP8Decoder *dec,VP8ThreadContext *ctx)

{
  uint8_t *puVar1;
  int *piVar2;
  uint8_t *puVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint8_t *puVar9;
  VP8MBData *pVVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  VP8DecIdct *pp_Var17;
  VP8TopSamples *pVVar18;
  ulong uVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  
  iVar14 = ctx->mb_y_;
  iVar5 = ctx->id_;
  puVar9 = dec->yuv_b_;
  lVar15 = 0;
  do {
    puVar9[lVar15 + 0x27] = 0x81;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x200);
  puVar3 = puVar9 + 600;
  lVar15 = 0;
  do {
    puVar9[lVar15 + 0x247] = 0x81;
    puVar9[lVar15 + 599] = 0x81;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x100);
  if (iVar14 < 1) {
    builtin_memcpy(puVar9 + 7,
                   "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                   ,0x15);
    builtin_memcpy(puVar9 + 0x227,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",9);
    builtin_memcpy(puVar9 + 0x237,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",9);
  }
  else {
    puVar9[0x237] = 0x81;
    puVar9[0x227] = 0x81;
    puVar9[7] = 0x81;
  }
  if (0 < dec->mb_w_) {
    puVar1 = puVar9 + 0x28;
    piVar2 = (int *)(puVar9 + 0x18);
    lVar15 = 0x301;
    lVar23 = 0;
    do {
      pVVar10 = ctx->mb_data_;
      if (lVar23 != 0) {
        lVar16 = 0x14;
        do {
          *(undefined4 *)(puVar9 + lVar16 + -0x10) = *(undefined4 *)(puVar9 + lVar16);
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0x234);
        lVar16 = 0;
        do {
          *(undefined4 *)(puVar9 + lVar16 + 0x224) = *(undefined4 *)(puVar9 + lVar16 + 0x22c);
          *(undefined4 *)(puVar9 + lVar16 + 0x234) = *(undefined4 *)(puVar9 + lVar16 + 0x23c);
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0x120);
      }
      pVVar18 = dec->yuv_t_ + lVar23;
      uVar6 = pVVar10[lVar23].non_zero_y_;
      if (iVar14 < 1) {
        if (pVVar10[lVar23].is_i4x4_ != '\0') {
          iVar14 = *piVar2;
          goto LAB_0012dad7;
        }
      }
      else {
        uVar13 = *(undefined8 *)(pVVar18->y + 8);
        *(undefined8 *)(puVar9 + 8) = *(undefined8 *)pVVar18->y;
        *(undefined8 *)(puVar9 + 0x10) = uVar13;
        *(undefined8 *)(puVar9 + 0x228) = *(undefined8 *)pVVar18->u;
        *(undefined8 *)(puVar9 + 0x238) = *(undefined8 *)pVVar18->v;
        if (pVVar10[lVar23].is_i4x4_ != '\0') {
          if (lVar23 < (long)dec->mb_w_ + -1) {
            iVar14 = *(int *)pVVar18[1].y;
            *piVar2 = iVar14;
          }
          else {
            bVar4 = pVVar18->y[0xf];
            *piVar2 = (uint)bVar4 * 0x1010101;
            iVar14 = CONCAT22(CONCAT11(bVar4,bVar4),CONCAT11(bVar4,bVar4));
          }
LAB_0012dad7:
          *(int *)(puVar9 + 0x198) = iVar14;
          *(int *)(puVar9 + 0x118) = iVar14;
          *(int *)(puVar9 + 0x98) = iVar14;
          (*VP8PredLuma4[*(byte *)((long)pVVar10->coeffs_ + lVar15)])(puVar1);
          (*(code *)(&DAT_001b40e0 + *(int *)(&DAT_001b40e0 + (ulong)(uVar6 >> 0x1e) * 4)))();
          return;
        }
      }
      uVar24 = (ulong)((uint)(iVar14 == 0) * 4);
      if (lVar23 == 0) {
        uVar24 = (ulong)(iVar14 == 0) + 5;
      }
      uVar19 = uVar24;
      if (pVVar10[lVar23].imodes_[0] != 0) {
        uVar19 = (ulong)pVVar10[lVar23].imodes_[0];
      }
      (*VP8PredLuma16[uVar19])(puVar1);
      if (uVar6 != 0) {
        (*(code *)(&DAT_001b40f0 + *(int *)(&DAT_001b40f0 + (ulong)(uVar6 >> 0x1e) * 4)))();
        return;
      }
      uVar6 = pVVar10[lVar23].non_zero_uv_;
      if (pVVar10[lVar23].uvmode_ != 0) {
        uVar24 = (ulong)pVVar10[lVar23].uvmode_;
      }
      (*VP8PredChroma8[uVar24])(puVar9 + 0x248);
      (*VP8PredChroma8[uVar24])(puVar3);
      if ((char)uVar6 != '\0') {
        pp_Var17 = &VP8TransformUV;
        if ((uVar6 & 0xaa) == 0) {
          pp_Var17 = &VP8TransformDCUV;
        }
        (**pp_Var17)(pVVar10[lVar23].coeffs_ + 0x100,puVar9 + 0x248);
      }
      if ((uVar6 & 0xff00) != 0) {
        pp_Var17 = &VP8TransformUV;
        if ((uVar6 & 0xaa00) == 0) {
          pp_Var17 = &VP8TransformDCUV;
        }
        (**pp_Var17)(pVVar10[lVar23].coeffs_ + 0x140,puVar3);
      }
      if (iVar14 < dec->mb_h_ + -1) {
        uVar13 = *(undefined8 *)(puVar9 + 0x210);
        *(undefined8 *)pVVar18->y = *(undefined8 *)(puVar9 + 0x208);
        *(undefined8 *)(pVVar18->y + 8) = uVar13;
        *(undefined8 *)pVVar18->u = *(undefined8 *)(puVar9 + 0x328);
        *(undefined8 *)pVVar18->v = *(undefined8 *)(puVar9 + 0x338);
      }
      iVar7 = dec->cache_y_stride_;
      puVar20 = dec->cache_y_;
      lVar16 = (long)dec->cache_uv_stride_ * (long)iVar5 * 8;
      puVar11 = dec->cache_u_;
      puVar12 = dec->cache_v_;
      lVar22 = 0;
      puVar21 = puVar1;
      do {
        iVar8 = dec->cache_y_stride_;
        uVar13 = *(undefined8 *)(puVar21 + 8);
        *(undefined8 *)
         (puVar20 +
         (long)(int)lVar22 * (long)iVar8 + (long)iVar7 * (long)iVar5 * 0x10 + lVar23 * 0x10) =
             *(undefined8 *)puVar21;
        *(undefined8 *)
         (puVar20 + (long)(int)lVar22 * (long)iVar8 +
                    (long)iVar7 * (long)iVar5 * 0x10 + lVar23 * 0x10 + 8) = uVar13;
        lVar22 = lVar22 + 1;
        puVar21 = puVar21 + 0x20;
      } while (lVar22 != 0x10);
      lVar22 = 0;
      puVar20 = puVar3;
      do {
        *(undefined8 *)
         (puVar11 + (long)dec->cache_uv_stride_ * (long)(int)lVar22 + lVar16 + lVar23 * 8) =
             *(undefined8 *)(puVar20 + -0x10);
        *(undefined8 *)
         (puVar12 + (long)dec->cache_uv_stride_ * (long)(int)lVar22 + lVar16 + lVar23 * 8) =
             *(undefined8 *)puVar20;
        lVar22 = lVar22 + 1;
        puVar20 = puVar20 + 0x20;
      } while (lVar22 != 8);
      lVar23 = lVar23 + 1;
      lVar15 = lVar15 + 800;
    } while (lVar23 < dec->mb_w_);
  }
  return;
}

Assistant:

static void ReconstructRow(const VP8Decoder* const dec,
                           const VP8ThreadContext* ctx) {
  int j;
  int mb_x;
  const int mb_y = ctx->mb_y_;
  const int cache_id = ctx->id_;
  uint8_t* const y_dst = dec->yuv_b_ + Y_OFF;
  uint8_t* const u_dst = dec->yuv_b_ + U_OFF;
  uint8_t* const v_dst = dec->yuv_b_ + V_OFF;

  // Initialize left-most block.
  for (j = 0; j < 16; ++j) {
    y_dst[j * BPS - 1] = 129;
  }
  for (j = 0; j < 8; ++j) {
    u_dst[j * BPS - 1] = 129;
    v_dst[j * BPS - 1] = 129;
  }

  // Init top-left sample on left column too.
  if (mb_y > 0) {
    y_dst[-1 - BPS] = u_dst[-1 - BPS] = v_dst[-1 - BPS] = 129;
  } else {
    // we only need to do this init once at block (0,0).
    // Afterward, it remains valid for the whole topmost row.
    memset(y_dst - BPS - 1, 127, 16 + 4 + 1);
    memset(u_dst - BPS - 1, 127, 8 + 1);
    memset(v_dst - BPS - 1, 127, 8 + 1);
  }

  // Reconstruct one row.
  for (mb_x = 0; mb_x < dec->mb_w_; ++mb_x) {
    const VP8MBData* const block = ctx->mb_data_ + mb_x;

    // Rotate in the left samples from previously decoded block. We move four
    // pixels at a time for alignment reason, and because of in-loop filter.
    if (mb_x > 0) {
      for (j = -1; j < 16; ++j) {
        Copy32b(&y_dst[j * BPS - 4], &y_dst[j * BPS + 12]);
      }
      for (j = -1; j < 8; ++j) {
        Copy32b(&u_dst[j * BPS - 4], &u_dst[j * BPS + 4]);
        Copy32b(&v_dst[j * BPS - 4], &v_dst[j * BPS + 4]);
      }
    }
    {
      // bring top samples into the cache
      VP8TopSamples* const top_yuv = dec->yuv_t_ + mb_x;
      const int16_t* const coeffs = block->coeffs_;
      uint32_t bits = block->non_zero_y_;
      int n;

      if (mb_y > 0) {
        memcpy(y_dst - BPS, top_yuv[0].y, 16);
        memcpy(u_dst - BPS, top_yuv[0].u, 8);
        memcpy(v_dst - BPS, top_yuv[0].v, 8);
      }

      // predict and add residuals
      if (block->is_i4x4_) {   // 4x4
        uint32_t* const top_right = (uint32_t*)(y_dst - BPS + 16);

        if (mb_y > 0) {
          if (mb_x >= dec->mb_w_ - 1) {    // on rightmost border
            memset(top_right, top_yuv[0].y[15], sizeof(*top_right));
          } else {
            memcpy(top_right, top_yuv[1].y, sizeof(*top_right));
          }
        }
        // replicate the top-right pixels below
        top_right[BPS] = top_right[2 * BPS] = top_right[3 * BPS] = top_right[0];

        // predict and add residuals for all 4x4 blocks in turn.
        for (n = 0; n < 16; ++n, bits <<= 2) {
          uint8_t* const dst = y_dst + kScan[n];
          VP8PredLuma4[block->imodes_[n]](dst);
          DoTransform(bits, coeffs + n * 16, dst);
        }
      } else {    // 16x16
        const int pred_func = CheckMode(mb_x, mb_y, block->imodes_[0]);
        VP8PredLuma16[pred_func](y_dst);
        if (bits != 0) {
          for (n = 0; n < 16; ++n, bits <<= 2) {
            DoTransform(bits, coeffs + n * 16, y_dst + kScan[n]);
          }
        }
      }
      {
        // Chroma
        const uint32_t bits_uv = block->non_zero_uv_;
        const int pred_func = CheckMode(mb_x, mb_y, block->uvmode_);
        VP8PredChroma8[pred_func](u_dst);
        VP8PredChroma8[pred_func](v_dst);
        DoUVTransform(bits_uv >> 0, coeffs + 16 * 16, u_dst);
        DoUVTransform(bits_uv >> 8, coeffs + 20 * 16, v_dst);
      }

      // stash away top samples for next block
      if (mb_y < dec->mb_h_ - 1) {
        memcpy(top_yuv[0].y, y_dst + 15 * BPS, 16);
        memcpy(top_yuv[0].u, u_dst +  7 * BPS,  8);
        memcpy(top_yuv[0].v, v_dst +  7 * BPS,  8);
      }
    }
    // Transfer reconstructed samples from yuv_b_ cache to final destination.
    {
      const int y_offset = cache_id * 16 * dec->cache_y_stride_;
      const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
      uint8_t* const y_out = dec->cache_y_ + mb_x * 16 + y_offset;
      uint8_t* const u_out = dec->cache_u_ + mb_x * 8 + uv_offset;
      uint8_t* const v_out = dec->cache_v_ + mb_x * 8 + uv_offset;
      for (j = 0; j < 16; ++j) {
        memcpy(y_out + j * dec->cache_y_stride_, y_dst + j * BPS, 16);
      }
      for (j = 0; j < 8; ++j) {
        memcpy(u_out + j * dec->cache_uv_stride_, u_dst + j * BPS, 8);
        memcpy(v_out + j * dec->cache_uv_stride_, v_dst + j * BPS, 8);
      }
    }
  }
}